

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O1

void __thiscall
duckdb::FixedBatchCopyGlobalState::AddBatchData
          (FixedBatchCopyGlobalState *this,idx_t batch_index,
          unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>,_true>
          *new_batch,idx_t memory_usage)

{
  _Head_base<0UL,_duckdb::PreparedBatchData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::PreparedBatchData_*,_false> _Var2;
  int iVar3;
  pointer pFVar4;
  InternalException *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>_>,_bool>
  pVar5;
  templated_unique_single_t prepared_data;
  _Head_base<0UL,_duckdb::FixedPreparedBatchData_*,_false> local_58;
  string local_50;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  local_58._M_head_impl = (FixedPreparedBatchData *)operator_new(0x10);
  (local_58._M_head_impl)->memory_usage = 0;
  ((local_58._M_head_impl)->prepared_data).
  super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>._M_t.
  super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
  .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl = (PreparedBatchData *)0x0
  ;
  pFVar4 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
           ::operator->((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                         *)&local_58);
  _Var1._M_head_impl =
       (new_batch->
       super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>)
       ._M_t.
       super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
       .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl;
  (new_batch->
  super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>)._M_t
  .super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
  .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl = (PreparedBatchData *)0x0
  ;
  _Var2._M_head_impl =
       (pFVar4->prepared_data).
       super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
       .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl;
  (pFVar4->prepared_data).
  super_unique_ptr<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>._M_t.
  super___uniq_ptr_impl<duckdb::PreparedBatchData,_std::default_delete<duckdb::PreparedBatchData>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::PreparedBatchData_*,_std::default_delete<duckdb::PreparedBatchData>_>
  .super__Head_base<0UL,_duckdb::PreparedBatchData_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (PreparedBatchData *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_PreparedBatchData[1])();
  }
  pFVar4 = unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
           ::operator->((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>
                         *)&local_58);
  pFVar4->memory_usage = memory_usage;
  local_50._M_string_length = (size_type)local_58._M_head_impl;
  local_58._M_head_impl = (FixedPreparedBatchData *)0x0;
  local_50._M_dataplus._M_p = (pointer)batch_index;
  pVar5 = ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedPreparedBatchData,std::default_delete<duckdb::FixedPreparedBatchData>,true>>>>
                      *)&this->batch_data,
                     (pair<unsigned_long,_duckdb::unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>,_true>_>
                      *)&local_50);
  ::std::
  unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>::
  ~unique_ptr((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
               *)&local_50._M_string_length);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ::std::
    unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
    ::~unique_ptr((unique_ptr<duckdb::FixedPreparedBatchData,_std::default_delete<duckdb::FixedPreparedBatchData>_>
                   *)&local_58);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Duplicate batch index %llu encountered in PhysicalFixedBatchCopy",
             "");
  InternalException::InternalException<unsigned_long>(this_00,&local_50,batch_index);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void AddBatchData(idx_t batch_index, unique_ptr<PreparedBatchData> new_batch, idx_t memory_usage) {
		// move the batch data to the set of prepared batch data
		lock_guard<mutex> l(lock);
		auto prepared_data = make_uniq<FixedPreparedBatchData>();
		prepared_data->prepared_data = std::move(new_batch);
		prepared_data->memory_usage = memory_usage;
		auto entry = batch_data.insert(make_pair(batch_index, std::move(prepared_data)));
		if (!entry.second) {
			throw InternalException("Duplicate batch index %llu encountered in PhysicalFixedBatchCopy", batch_index);
		}
	}